

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O0

int D_PickRandomTeam(void)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FTeam *pFVar5;
  uint local_24;
  int local_20;
  uint i_2;
  int lowestTie;
  int lowest;
  int i_1;
  int team;
  int numTeams;
  uint i;
  
  for (team = 0; uVar2 = TArray<FTeam,_FTeam>::Size(&Teams), (uint)team < uVar2; team = team + 1) {
    pFVar5 = TArray<FTeam,_FTeam>::operator[](&Teams,(ulong)(uint)team);
    pFVar5->m_iPresent = 0;
    pFVar5 = TArray<FTeam,_FTeam>::operator[](&Teams,(ulong)(uint)team);
    pFVar5->m_iTies = 0;
  }
  i_1 = 0;
  for (lowestTie = 0; lowestTie < 8; lowestTie = lowestTie + 1) {
    if ((playeringame[lowestTie] & 1U) != 0) {
      uVar2 = userinfo_t::GetTeam((userinfo_t *)((long)lowestTie * 0x2a0 + 0x1ae70f8));
      bVar1 = FTeam::IsValidTeam(&TeamLibrary,uVar2);
      if (bVar1) {
        pFVar5 = TArray<FTeam,_FTeam>::operator[](&Teams,(long)(int)uVar2);
        iVar4 = pFVar5->m_iPresent;
        pFVar5->m_iPresent = iVar4 + 1;
        if (iVar4 == 0) {
          i_1 = i_1 + 1;
        }
      }
    }
  }
  if (i_1 < 2) {
    do {
      uVar2 = FRandom::operator()(&pr_pickteam);
      uVar3 = TArray<FTeam,_FTeam>::Size(&Teams);
      lowest = uVar2 % uVar3;
      pFVar5 = TArray<FTeam,_FTeam>::operator[](&Teams,(long)lowest);
    } while (pFVar5->m_iPresent != 0);
  }
  else {
    i_2 = 0x7fffffff;
    local_20 = 0;
    for (local_24 = 0; uVar2 = TArray<FTeam,_FTeam>::Size(&Teams), local_24 < uVar2;
        local_24 = local_24 + 1) {
      pFVar5 = TArray<FTeam,_FTeam>::operator[](&Teams,(ulong)local_24);
      if (0 < pFVar5->m_iPresent) {
        pFVar5 = TArray<FTeam,_FTeam>::operator[](&Teams,(ulong)local_24);
        if (pFVar5->m_iPresent < (int)i_2) {
          pFVar5 = TArray<FTeam,_FTeam>::operator[](&Teams,(ulong)local_24);
          i_2 = pFVar5->m_iPresent;
          local_20 = 0;
          pFVar5 = TArray<FTeam,_FTeam>::operator[](&Teams,0);
          pFVar5->m_iTies = local_24;
        }
        else {
          pFVar5 = TArray<FTeam,_FTeam>::operator[](&Teams,(ulong)local_24);
          if (pFVar5->m_iPresent == i_2) {
            local_20 = local_20 + 1;
            pFVar5 = TArray<FTeam,_FTeam>::operator[](&Teams,(long)local_20);
            pFVar5->m_iTies = local_24;
          }
        }
      }
    }
    if (local_20 == 0) {
      pFVar5 = TArray<FTeam,_FTeam>::operator[](&Teams,0);
      lowest = pFVar5->m_iTies;
    }
    else {
      iVar4 = FRandom::operator()(&pr_pickteam);
      pFVar5 = TArray<FTeam,_FTeam>::operator[](&Teams,(long)(iVar4 % (local_20 + 1)));
      lowest = pFVar5->m_iTies;
    }
  }
  return lowest;
}

Assistant:

int D_PickRandomTeam ()
{
	for (unsigned int i = 0; i < Teams.Size (); i++)
	{
		Teams[i].m_iPresent = 0;
		Teams[i].m_iTies = 0;
	}

	int numTeams = 0;
	int team;

	for (int i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			team = players[i].userinfo.GetTeam();
			if (TeamLibrary.IsValidTeam(team))
			{
				if (Teams[team].m_iPresent++ == 0)
				{
					numTeams++;
				}
			}
		}
	}

	if (numTeams < 2)
	{
		do
		{
			team = pr_pickteam() % Teams.Size();
		} while (Teams[team].m_iPresent != 0);
	}
	else
	{
		int lowest = INT_MAX, lowestTie = 0;
		unsigned int i;

		for (i = 0; i < Teams.Size (); ++i)
		{
			if (Teams[i].m_iPresent > 0)
			{
				if (Teams[i].m_iPresent < lowest)
				{
					lowest = Teams[i].m_iPresent;
					lowestTie = 0;
					Teams[0].m_iTies = i;
				}
				else if (Teams[i].m_iPresent == lowest)
				{
					Teams[++lowestTie].m_iTies = i;
				}
			}
		}
		if (lowestTie == 0)
		{
			team = Teams[0].m_iTies;
		}
		else
		{
			team = Teams[pr_pickteam() % (lowestTie+1)].m_iTies;
		}
	}

	return team;
}